

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar2;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar3;
  float *pfVar4;
  StackItemT<embree::NodeRefPtr<4>_> SVar5;
  AccelData *pAVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  _func_int **pp_Var12;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar13;
  undefined4 uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  size_t sVar24;
  size_t sVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  vint4 bi;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi_2;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 bi_3;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_5;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai_2;
  undefined1 auVar61 [16];
  vint4 bi_4;
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  vint<4> octant;
  vint4 bi_10;
  undefined1 local_11a8 [16];
  RTCIntersectFunctionNArguments local_1198;
  Geometry *local_1168;
  undefined8 local_1160;
  RTCIntersectArguments *local_1158;
  undefined1 local_1148 [16];
  vfloat<4> fmin;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [8];
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  auVar26 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar30 = vpcmpeqd_avx(auVar26,(undefined1  [16])valid_i->field_0);
  uVar11 = vmovmskps_avx(auVar30);
  if (uVar11 != 0) {
    pAVar6 = This->ptr;
    uVar16 = (ulong)(uVar11 & 0xff);
    auVar64 = ZEXT1664(*(undefined1 (*) [16])ray);
    auVar65 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
    auVar66 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
    auVar29 = *(undefined1 (*) [16])(ray + 0x40);
    auVar38._8_4_ = 0x7fffffff;
    auVar38._0_8_ = 0x7fffffff7fffffff;
    auVar38._12_4_ = 0x7fffffff;
    auVar33 = vandps_avx(auVar29,auVar38);
    auVar52._8_4_ = 0x219392ef;
    auVar52._0_8_ = 0x219392ef219392ef;
    auVar52._12_4_ = 0x219392ef;
    auVar33 = vcmpps_avx(auVar33,auVar52,1);
    auVar40 = vblendvps_avx(auVar29,auVar52,auVar33);
    auVar33 = *(undefined1 (*) [16])(ray + 0x50);
    auVar47 = vandps_avx(auVar33,auVar38);
    auVar47 = vcmpps_avx(auVar47,auVar52,1);
    auVar39 = vblendvps_avx(auVar33,auVar52,auVar47);
    auVar47 = *(undefined1 (*) [16])(ray + 0x60);
    auVar38 = vandps_avx(auVar47,auVar38);
    auVar38 = vcmpps_avx(auVar38,auVar52,1);
    auVar38 = vblendvps_avx(auVar47,auVar52,auVar38);
    auVar46 = vrcpps_avx(auVar40);
    fVar7 = auVar46._0_4_;
    auVar45._0_4_ = auVar40._0_4_ * fVar7;
    fVar8 = auVar46._4_4_;
    auVar45._4_4_ = auVar40._4_4_ * fVar8;
    fVar9 = auVar46._8_4_;
    auVar45._8_4_ = auVar40._8_4_ * fVar9;
    fVar10 = auVar46._12_4_;
    auVar45._12_4_ = auVar40._12_4_ * fVar10;
    auVar62._8_4_ = 0x3f800000;
    auVar62._0_8_ = 0x3f8000003f800000;
    auVar62._12_4_ = 0x3f800000;
    auVar40 = vsubps_avx(auVar62,auVar45);
    local_1098._0_4_ = fVar7 + fVar7 * auVar40._0_4_;
    local_1098._4_4_ = fVar8 + fVar8 * auVar40._4_4_;
    local_1098._8_4_ = fVar9 + fVar9 * auVar40._8_4_;
    local_1098._12_4_ = fVar10 + fVar10 * auVar40._12_4_;
    auVar67 = ZEXT1664(local_1098);
    auVar40 = vrcpps_avx(auVar39);
    fVar7 = auVar40._0_4_;
    auVar53._0_4_ = auVar39._0_4_ * fVar7;
    fVar8 = auVar40._4_4_;
    auVar53._4_4_ = auVar39._4_4_ * fVar8;
    fVar9 = auVar40._8_4_;
    auVar53._8_4_ = auVar39._8_4_ * fVar9;
    fVar10 = auVar40._12_4_;
    auVar53._12_4_ = auVar39._12_4_ * fVar10;
    auVar40 = vsubps_avx(auVar62,auVar53);
    local_10a8._0_4_ = fVar7 + fVar7 * auVar40._0_4_;
    local_10a8._4_4_ = fVar8 + fVar8 * auVar40._4_4_;
    local_10a8._8_4_ = fVar9 + fVar9 * auVar40._8_4_;
    local_10a8._12_4_ = fVar10 + fVar10 * auVar40._12_4_;
    auVar68 = ZEXT1664(local_10a8);
    auVar40 = vrcpps_avx(auVar38);
    fVar7 = auVar40._0_4_;
    auVar39._0_4_ = auVar38._0_4_ * fVar7;
    fVar8 = auVar40._4_4_;
    auVar39._4_4_ = auVar38._4_4_ * fVar8;
    fVar9 = auVar40._8_4_;
    auVar39._8_4_ = auVar38._8_4_ * fVar9;
    fVar10 = auVar40._12_4_;
    auVar39._12_4_ = auVar38._12_4_ * fVar10;
    auVar38 = vsubps_avx(auVar62,auVar39);
    local_10b8._0_4_ = fVar7 + fVar7 * auVar38._0_4_;
    local_10b8._4_4_ = fVar8 + fVar8 * auVar38._4_4_;
    local_10b8._8_4_ = fVar9 + fVar9 * auVar38._8_4_;
    local_10b8._12_4_ = fVar10 + fVar10 * auVar38._12_4_;
    auVar63 = ZEXT1664(local_10b8);
    auVar38 = ZEXT416(0) << 0x20;
    local_10c8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar38);
    local_10d8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar38);
    auVar29 = vcmpps_avx(auVar29,auVar38,1);
    auVar40._8_4_ = 1;
    auVar40._0_8_ = 0x100000001;
    auVar40._12_4_ = 1;
    auVar29 = vandps_avx(auVar29,auVar40);
    auVar33 = vcmpps_avx(auVar33,auVar38,1);
    auVar46._8_4_ = 2;
    auVar46._0_8_ = 0x200000002;
    auVar46._12_4_ = 2;
    auVar33 = vandps_avx(auVar33,auVar46);
    auVar33 = vorps_avx(auVar33,auVar29);
    auVar29 = vcmpps_avx(auVar47,auVar38,1);
    auVar47._8_4_ = 4;
    auVar47._0_8_ = 0x400000004;
    auVar47._12_4_ = 4;
    auVar29 = vandps_avx(auVar29,auVar47);
    auVar26 = vpor_avx(auVar30 ^ auVar26,auVar29);
    local_10e8 = vpor_avx(auVar26,auVar33);
    local_1068 = *(undefined1 (*) [16])ray;
    local_1078 = *(undefined1 (*) [16])(ray + 0x10);
    local_1088 = *(undefined1 (*) [16])(ray + 0x20);
    do {
      lVar17 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
        }
      }
      uVar14 = *(undefined4 *)(local_10e8 + lVar17 * 4);
      auVar26._4_4_ = uVar14;
      auVar26._0_4_ = uVar14;
      auVar26._8_4_ = uVar14;
      auVar26._12_4_ = uVar14;
      auVar33 = vpcmpeqd_avx(auVar26,local_10e8);
      uVar14 = vmovmskps_avx(auVar33);
      uVar16 = ~CONCAT44((int)((ulong)lVar17 >> 0x20),uVar14) & uVar16;
      auVar58._8_4_ = 0x7f800000;
      auVar58._0_8_ = 0x7f8000007f800000;
      auVar58._12_4_ = 0x7f800000;
      auVar26 = vblendvps_avx(auVar58,auVar64._0_16_,auVar33);
      auVar30 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar30 = vminps_avx(auVar30,auVar26);
      auVar29 = vshufpd_avx(auVar30,auVar30,1);
      auVar26 = vblendvps_avx(auVar58,auVar65._0_16_,auVar33);
      auVar30 = vminps_avx(auVar29,auVar30);
      auVar29 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vminps_avx(auVar29,auVar26);
      auVar29 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vminps_avx(auVar29,auVar26);
      auVar30 = vinsertps_avx(auVar30,auVar26,0x1c);
      auVar26 = vblendvps_avx(auVar58,auVar66._0_16_,auVar33);
      auVar29 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vminps_avx(auVar29,auVar26);
      auVar29 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vminps_avx(auVar29,auVar26);
      auVar29 = vinsertps_avx(auVar30,auVar26,0x20);
      auVar61._8_4_ = 0xff800000;
      auVar61._0_8_ = 0xff800000ff800000;
      auVar61._12_4_ = 0xff800000;
      auVar26 = vblendvps_avx(auVar61,auVar64._0_16_,auVar33);
      auVar30 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar30 = vmaxps_avx(auVar30,auVar26);
      auVar47 = vshufpd_avx(auVar30,auVar30,1);
      auVar26 = vblendvps_avx(auVar61,auVar65._0_16_,auVar33);
      auVar30 = vmaxps_avx(auVar47,auVar30);
      auVar47 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vmaxps_avx(auVar47,auVar26);
      auVar47 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vmaxps_avx(auVar47,auVar26);
      auVar30 = vinsertps_avx(auVar30,auVar26,0x1c);
      auVar26 = vblendvps_avx(auVar61,auVar66._0_16_,auVar33);
      auVar47 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vmaxps_avx(auVar47,auVar26);
      auVar47 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vmaxps_avx(auVar47,auVar26);
      auVar47 = vinsertps_avx(auVar30,auVar26,0x20);
      auVar26 = vblendvps_avx(auVar58,auVar67._0_16_,auVar33);
      auVar30 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar30 = vminps_avx(auVar30,auVar26);
      auVar38 = vshufpd_avx(auVar30,auVar30,1);
      auVar26 = vblendvps_avx(auVar58,auVar68._0_16_,auVar33);
      auVar30 = vminps_avx(auVar38,auVar30);
      auVar38 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vminps_avx(auVar38,auVar26);
      auVar38 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vminps_avx(auVar38,auVar26);
      auVar30 = vinsertps_avx(auVar30,auVar26,0x1c);
      auVar26 = vblendvps_avx(auVar58,auVar63._0_16_,auVar33);
      auVar38 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vminps_avx(auVar38,auVar26);
      auVar38 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vminps_avx(auVar38,auVar26);
      auVar38 = vinsertps_avx(auVar30,auVar26,0x20);
      auVar26 = vblendvps_avx(auVar61,auVar67._0_16_,auVar33);
      auVar30 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar30 = vmaxps_avx(auVar30,auVar26);
      auVar40 = vshufpd_avx(auVar30,auVar30,1);
      auVar26 = vblendvps_avx(auVar61,auVar68._0_16_,auVar33);
      auVar30 = vmaxps_avx(auVar40,auVar30);
      auVar40 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vmaxps_avx(auVar40,auVar26);
      auVar40 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vmaxps_avx(auVar40,auVar26);
      auVar30 = vinsertps_avx(auVar30,auVar26,0x1c);
      auVar26 = vblendvps_avx(auVar61,auVar63._0_16_,auVar33);
      auVar40 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vmaxps_avx(auVar40,auVar26);
      auVar40 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vmaxps_avx(auVar40,auVar26);
      auVar40 = vinsertps_avx(auVar30,auVar26,0x20);
      local_f88 = vblendvps_avx(auVar58,local_10c8,auVar33);
      auVar26 = vshufps_avx(local_f88,local_f88,0xb1);
      auVar46 = vminps_avx(auVar26,local_f88);
      bi_10.field_0 =
           (anon_union_16_2_9473010e_for_vint_impl<4>_1)vblendvps_avx(auVar61,local_10d8,auVar33);
      auVar26 = vshufps_avx((undefined1  [16])bi_10.field_0,(undefined1  [16])bi_10.field_0,0xb1);
      auVar39 = vmaxps_avx(auVar26,(undefined1  [16])bi_10.field_0);
      auVar33 = vcmpps_avx(auVar38,_DAT_01f7aa10,5);
      auVar26 = vblendvps_avx(auVar40,auVar38,auVar33);
      auVar30 = vblendvps_avx(auVar29,auVar47,auVar33);
      auVar29 = vblendvps_avx(auVar47,auVar29,auVar33);
      auVar45 = vshufpd_avx(auVar39,auVar39,1);
      auVar47 = vmovshdup_avx(auVar26);
      uVar21 = (ulong)(auVar47._0_4_ < 0.0) << 4 | 0x20;
      auVar47 = vshufpd_avx(auVar26,auVar26,1);
      local_11a8 = vmaxps_avx(auVar45,auVar39);
      uVar22 = (ulong)(auVar47._0_4_ < 0.0) << 4 | 0x40;
      auVar33 = vblendvps_avx(auVar38,auVar40,auVar33);
      auVar48._0_4_ = auVar30._0_4_ * auVar26._0_4_;
      auVar48._4_4_ = auVar30._4_4_ * auVar26._4_4_;
      auVar48._8_4_ = auVar30._8_4_ * auVar26._8_4_;
      auVar48._12_4_ = auVar30._12_4_ * auVar26._12_4_;
      auVar32._0_4_ = auVar29._0_4_ * auVar33._0_4_;
      auVar32._4_4_ = auVar29._4_4_ * auVar33._4_4_;
      auVar32._8_4_ = auVar29._8_4_ * auVar33._8_4_;
      auVar32._12_4_ = auVar29._12_4_ * auVar33._12_4_;
      uVar20 = (ulong)(auVar26._0_4_ < 0.0) * 0x10;
      stack[0].ptr.ptr = *(size_t *)&pAVar6[1].bounds.bounds0.lower.field_0;
      stack[0].dist = 0;
      _local_f98 = vshufps_avx(auVar26,auVar26,0);
      local_fa8 = vshufps_avx(auVar48,auVar48,0);
      _local_fb8 = vshufps_avx(auVar26,auVar26,0x55);
      local_fc8 = vshufps_avx(auVar48,auVar48,0x55);
      _local_fd8 = vshufps_avx(auVar26,auVar26,0xaa);
      local_fe8 = vshufps_avx(auVar48,auVar48,0xaa);
      _local_ff8 = vshufps_avx(auVar33,auVar33,0);
      local_1008 = vshufps_avx(auVar32,auVar32,0);
      _local_1018 = vshufps_avx(auVar33,auVar33,0x55);
      auVar26 = vshufps_avx(auVar46,auVar46,0);
      auVar30 = vshufps_avx(auVar46,auVar46,0xaa);
      local_1148 = vminps_avx(auVar30,auVar26);
      local_1028 = vshufps_avx(auVar32,auVar32,0x55);
      _local_1038 = vshufps_avx(auVar33,auVar33,0xaa);
      local_1048 = vshufps_avx(auVar32,auVar32,0xaa);
      pSVar13 = stack + 1;
      auVar26 = vshufps_avx(local_11a8,local_11a8,0);
      auVar28 = ZEXT1664(auVar26);
      do {
        uVar11 = pSVar13[-1].dist;
        auVar30._4_4_ = uVar11;
        auVar30._0_4_ = uVar11;
        auVar30._8_4_ = uVar11;
        auVar30._12_4_ = uVar11;
        auVar31 = ZEXT1664(auVar30);
        pSVar13 = pSVar13 + -1;
        auVar26 = vcmpps_avx(auVar30,(undefined1  [16])bi_10.field_0,1);
        if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar26[0xf] < '\0') {
          sVar23 = (pSVar13->ptr).ptr;
          while ((sVar23 & 8) == 0) {
            pfVar4 = (float *)(sVar23 + 0x20 + uVar20);
            auVar29._0_4_ = (float)local_f98._0_4_ * *pfVar4;
            auVar29._4_4_ = (float)local_f98._4_4_ * pfVar4[1];
            auVar29._8_4_ = fStack_f90 * pfVar4[2];
            auVar29._12_4_ = fStack_f8c * pfVar4[3];
            pfVar4 = (float *)(sVar23 + 0x20 + uVar21);
            auVar33._0_4_ = (float)local_fb8._0_4_ * *pfVar4;
            auVar33._4_4_ = (float)local_fb8._4_4_ * pfVar4[1];
            auVar33._8_4_ = fStack_fb0 * pfVar4[2];
            auVar33._12_4_ = fStack_fac * pfVar4[3];
            auVar26 = vsubps_avx(auVar29,local_fa8);
            auVar30 = vsubps_avx(auVar33,local_fc8);
            pfVar4 = (float *)(sVar23 + 0x20 + uVar22);
            auVar41._0_4_ = (float)local_fd8._0_4_ * *pfVar4;
            auVar41._4_4_ = (float)local_fd8._4_4_ * pfVar4[1];
            auVar41._8_4_ = fStack_fd0 * pfVar4[2];
            auVar41._12_4_ = fStack_fcc * pfVar4[3];
            auVar26 = vpmaxsd_avx(auVar26,auVar30);
            auVar30 = vsubps_avx(auVar41,local_fe8);
            auVar30 = vpmaxsd_avx(auVar30,local_1148);
            fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vpmaxsd_avx(auVar26,auVar30);
            pfVar4 = (float *)(sVar23 + 0x20 + (uVar20 ^ 0x10));
            auVar34._0_4_ = (float)local_ff8._0_4_ * *pfVar4;
            auVar34._4_4_ = (float)local_ff8._4_4_ * pfVar4[1];
            auVar34._8_4_ = fStack_ff0 * pfVar4[2];
            auVar34._12_4_ = fStack_fec * pfVar4[3];
            pfVar4 = (float *)(sVar23 + 0x20 + (uVar21 ^ 0x10));
            auVar42._0_4_ = (float)local_1018._0_4_ * *pfVar4;
            auVar42._4_4_ = (float)local_1018._4_4_ * pfVar4[1];
            auVar42._8_4_ = fStack_1010 * pfVar4[2];
            auVar42._12_4_ = fStack_100c * pfVar4[3];
            auVar26 = vsubps_avx(auVar34,local_1008);
            auVar30 = vsubps_avx(auVar42,local_1028);
            pfVar4 = (float *)(sVar23 + 0x20 + (uVar22 ^ 0x10));
            auVar49._0_4_ = (float)local_1038._0_4_ * *pfVar4;
            auVar49._4_4_ = (float)local_1038._4_4_ * pfVar4[1];
            auVar49._8_4_ = fStack_1030 * pfVar4[2];
            auVar49._12_4_ = fStack_102c * pfVar4[3];
            auVar26 = vpminsd_avx(auVar26,auVar30);
            auVar30 = vsubps_avx(auVar49,local_1048);
            auVar30 = vpminsd_avx(auVar30,auVar28._0_16_);
            auVar26 = vpminsd_avx(auVar26,auVar30);
            auVar26 = vcmpps_avx((undefined1  [16])fmin.field_0,auVar26,2);
            iVar15 = vmovmskps_avx(auVar26);
            if (iVar15 == 0) goto LAB_0034cca4;
            uVar19 = (ulong)(byte)iVar15;
            auVar31 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar18 = 0;
            sVar24 = 8;
            do {
              lVar17 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              uVar14 = *(undefined4 *)(sVar23 + 0x20 + lVar17 * 4);
              auVar35._4_4_ = uVar14;
              auVar35._0_4_ = uVar14;
              auVar35._8_4_ = uVar14;
              auVar35._12_4_ = uVar14;
              auVar26 = vsubps_avx(auVar35,auVar64._0_16_);
              auVar36._0_4_ = auVar67._0_4_ * auVar26._0_4_;
              auVar36._4_4_ = auVar67._4_4_ * auVar26._4_4_;
              auVar36._8_4_ = auVar67._8_4_ * auVar26._8_4_;
              auVar36._12_4_ = auVar67._12_4_ * auVar26._12_4_;
              uVar14 = *(undefined4 *)(sVar23 + 0x40 + lVar17 * 4);
              auVar43._4_4_ = uVar14;
              auVar43._0_4_ = uVar14;
              auVar43._8_4_ = uVar14;
              auVar43._12_4_ = uVar14;
              auVar26 = vsubps_avx(auVar43,auVar65._0_16_);
              auVar44._0_4_ = auVar68._0_4_ * auVar26._0_4_;
              auVar44._4_4_ = auVar68._4_4_ * auVar26._4_4_;
              auVar44._8_4_ = auVar68._8_4_ * auVar26._8_4_;
              auVar44._12_4_ = auVar68._12_4_ * auVar26._12_4_;
              uVar14 = *(undefined4 *)(sVar23 + 0x60 + lVar17 * 4);
              auVar50._4_4_ = uVar14;
              auVar50._0_4_ = uVar14;
              auVar50._8_4_ = uVar14;
              auVar50._12_4_ = uVar14;
              auVar26 = vsubps_avx(auVar50,auVar66._0_16_);
              auVar51._0_4_ = auVar63._0_4_ * auVar26._0_4_;
              auVar51._4_4_ = auVar63._4_4_ * auVar26._4_4_;
              auVar51._8_4_ = auVar63._8_4_ * auVar26._8_4_;
              auVar51._12_4_ = auVar63._12_4_ * auVar26._12_4_;
              uVar14 = *(undefined4 *)(sVar23 + 0x30 + lVar17 * 4);
              auVar54._4_4_ = uVar14;
              auVar54._0_4_ = uVar14;
              auVar54._8_4_ = uVar14;
              auVar54._12_4_ = uVar14;
              auVar26 = vsubps_avx(auVar54,auVar64._0_16_);
              auVar55._0_4_ = auVar67._0_4_ * auVar26._0_4_;
              auVar55._4_4_ = auVar67._4_4_ * auVar26._4_4_;
              auVar55._8_4_ = auVar67._8_4_ * auVar26._8_4_;
              auVar55._12_4_ = auVar67._12_4_ * auVar26._12_4_;
              uVar14 = *(undefined4 *)(sVar23 + 0x50 + lVar17 * 4);
              auVar56._4_4_ = uVar14;
              auVar56._0_4_ = uVar14;
              auVar56._8_4_ = uVar14;
              auVar56._12_4_ = uVar14;
              auVar26 = vsubps_avx(auVar56,auVar65._0_16_);
              auVar57._0_4_ = auVar68._0_4_ * auVar26._0_4_;
              auVar57._4_4_ = auVar68._4_4_ * auVar26._4_4_;
              auVar57._8_4_ = auVar68._8_4_ * auVar26._8_4_;
              auVar57._12_4_ = auVar68._12_4_ * auVar26._12_4_;
              uVar14 = *(undefined4 *)(sVar23 + 0x70 + lVar17 * 4);
              auVar59._4_4_ = uVar14;
              auVar59._0_4_ = uVar14;
              auVar59._8_4_ = uVar14;
              auVar59._12_4_ = uVar14;
              auVar26 = vsubps_avx(auVar59,auVar66._0_16_);
              auVar60._0_4_ = auVar63._0_4_ * auVar26._0_4_;
              auVar60._4_4_ = auVar63._4_4_ * auVar26._4_4_;
              auVar60._8_4_ = auVar63._8_4_ * auVar26._8_4_;
              auVar60._12_4_ = auVar63._12_4_ * auVar26._12_4_;
              auVar26 = vpminsd_avx(auVar36,auVar55);
              auVar30 = vpminsd_avx(auVar44,auVar57);
              auVar26 = vpmaxsd_avx(auVar26,auVar30);
              auVar33 = vpminsd_avx(auVar51,auVar60);
              auVar30 = vpmaxsd_avx(auVar36,auVar55);
              auVar29 = vpmaxsd_avx(auVar44,auVar57);
              auVar47 = vpminsd_avx(auVar30,auVar29);
              auVar30 = vpmaxsd_avx(auVar51,auVar60);
              auVar29 = vpmaxsd_avx(auVar33,local_f88);
              auVar26 = vpmaxsd_avx(auVar26,auVar29);
              auVar30 = vpminsd_avx(auVar30,(undefined1  [16])bi_10.field_0);
              auVar30 = vpminsd_avx(auVar47,auVar30);
              auVar26 = vcmpps_avx(auVar26,auVar30,2);
              sVar25 = sVar24;
              if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar26[0xf] < '\0') {
                iVar15 = fmin.field_0.i[lVar17];
                auVar37._4_4_ = iVar15;
                auVar37._0_4_ = iVar15;
                auVar37._8_4_ = iVar15;
                auVar37._12_4_ = iVar15;
                sVar25 = *(size_t *)(sVar23 + lVar17 * 8);
                auVar30 = auVar31._0_16_;
                auVar26 = vcmpps_avx(auVar37,auVar30,1);
                if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar26[0xf]) {
                  (pSVar13->ptr).ptr = sVar25;
                  sVar25 = sVar24;
                }
                else {
                  if (sVar24 == 8) {
                    auVar31 = ZEXT1664(auVar37);
                    goto LAB_0034ca2b;
                  }
                  (pSVar13->ptr).ptr = sVar24;
                  auVar31 = ZEXT1664(auVar37);
                  auVar37 = auVar30;
                }
                uVar18 = uVar18 + 1;
                pSVar13->dist = auVar37._0_4_;
                pSVar13 = pSVar13 + 1;
              }
LAB_0034ca2b:
              uVar19 = uVar19 & uVar19 - 1;
              sVar24 = sVar25;
            } while (uVar19 != 0);
            if (sVar25 == 8) goto LAB_0034cca4;
            sVar23 = sVar25;
            if (1 < uVar18) {
              pSVar1 = pSVar13 + -2;
              pSVar2 = pSVar13 + -1;
              if (pSVar13[-2].dist < pSVar13[-1].dist) {
                SVar5 = *pSVar1;
                pSVar13[-2].dist = pSVar13[-1].dist;
                (pSVar1->ptr).ptr = (pSVar2->ptr).ptr;
                local_1198.valid = (int *)SVar5.ptr.ptr;
                (pSVar2->ptr).ptr = (size_t)local_1198.valid;
                local_1198.geometryUserPtr._0_4_ = SVar5.dist;
                pSVar13[-1].dist = (uint)local_1198.geometryUserPtr;
              }
              if (uVar18 != 2) {
                pSVar3 = pSVar13 + -3;
                uVar11 = pSVar13[-3].dist;
                if (uVar11 < pSVar13[-1].dist) {
                  SVar5 = *pSVar3;
                  pSVar13[-3].dist = pSVar13[-1].dist;
                  (pSVar3->ptr).ptr = (pSVar2->ptr).ptr;
                  local_1198.valid = (int *)SVar5.ptr.ptr;
                  (pSVar2->ptr).ptr = (size_t)local_1198.valid;
                  local_1198.geometryUserPtr._0_4_ = SVar5.dist;
                  pSVar13[-1].dist = (uint)local_1198.geometryUserPtr;
                  uVar11 = pSVar13[-3].dist;
                }
                if (uVar11 < pSVar13[-2].dist) {
                  SVar5 = *pSVar3;
                  pSVar13[-3].dist = pSVar13[-2].dist;
                  (pSVar3->ptr).ptr = (pSVar1->ptr).ptr;
                  local_1198.valid = (int *)SVar5.ptr.ptr;
                  (pSVar1->ptr).ptr = (size_t)local_1198.valid;
                  local_1198.geometryUserPtr._0_4_ = SVar5.dist;
                  pSVar13[-2].dist = (uint)local_1198.geometryUserPtr;
                }
              }
            }
          }
          auVar26 = vcmpps_avx((undefined1  [16])bi_10.field_0,auVar31._0_16_,6);
          auVar28 = ZEXT1664(auVar26);
          if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar26[0xf] < '\0') {
            uVar18 = (ulong)((uint)sVar23 & 0xf);
            if (uVar18 != 8) {
              lVar17 = 0;
              local_1058 = auVar26;
              do {
                local_1198.geomID = *(uint *)((sVar23 & 0xfffffffffffffff0) + lVar17 * 8);
                local_1168 = (context->scene->geometries).items[local_1198.geomID].ptr;
                uVar11 = local_1168->mask;
                auVar27._4_4_ = uVar11;
                auVar27._0_4_ = uVar11;
                auVar27._8_4_ = uVar11;
                auVar27._12_4_ = uVar11;
                auVar26 = vandps_avx(auVar27,*(undefined1 (*) [16])(ray + 0x90));
                auVar26 = vpcmpeqd_avx(auVar26,_DAT_01f7aa10);
                auVar30 = auVar28._0_16_ & ~auVar26;
                if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar30[0xf] < '\0') {
                  fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vandnps_avx(auVar26,auVar28._0_16_);
                  local_1198.primID = *(uint *)((sVar23 & 0xfffffffffffffff0) + 4 + lVar17 * 8);
                  local_1198.geometryUserPtr = local_1168->userPtr;
                  local_1198.valid = (int *)&fmin;
                  local_1198.context = context->user;
                  local_1198.N = 4;
                  local_1160 = 0;
                  local_1158 = context->args;
                  pp_Var12 = (_func_int **)local_1158->intersect;
                  if (pp_Var12 == (_func_int **)0x0) {
                    pp_Var12 = local_1168[1].super_RefCount._vptr_RefCount;
                  }
                  local_1198.rayhit = (RTCRayHitN *)ray;
                  (*(code *)pp_Var12)(&local_1198);
                  auVar64 = ZEXT1664(local_1068);
                  auVar65 = ZEXT1664(local_1078);
                  auVar66 = ZEXT1664(local_1088);
                  auVar67 = ZEXT1664(local_1098);
                  auVar68 = ZEXT1664(local_10a8);
                  auVar63 = ZEXT1664(local_10b8);
                  auVar28 = ZEXT1664(local_1058);
                }
                auVar26 = auVar28._0_16_;
                lVar17 = lVar17 + 1;
              } while (uVar18 - 8 != lVar17);
            }
            auVar30 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])bi_10.field_0,
                                 1);
            auVar30 = auVar26 & auVar30;
            if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar30[0xf] < '\0') {
              bi_10.field_0 =
                   (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   vblendvps_avx((undefined1  [16])bi_10.field_0,*(undefined1 (*) [16])(ray + 0x80),
                                 auVar26);
              auVar26 = vshufps_avx((undefined1  [16])bi_10.field_0,(undefined1  [16])bi_10.field_0,
                                    0xb1);
              auVar26 = vmaxps_avx(auVar26,(undefined1  [16])bi_10.field_0);
              auVar30 = vshufpd_avx(auVar26,auVar26,1);
              local_11a8 = vmaxss_avx(auVar30,auVar26);
            }
          }
        }
        auVar26 = vshufps_avx(local_11a8,local_11a8,0);
        auVar28 = ZEXT1664(auVar26);
LAB_0034cca4:
      } while (pSVar13 != stack);
    } while (uVar16 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }